

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

size_t ma_dr_flac__on_read_ogg(void *pUserData,void *bufferOut,size_t bytesToRead)

{
  uint uVar1;
  ma_bool32 mVar2;
  ulong __n;
  size_t bytesRemainingToRead;
  ulong __n_00;
  size_t sVar3;
  
  sVar3 = 0;
  while( true ) {
    __n_00 = bytesToRead - sVar3;
    if (bytesToRead < sVar3 || __n_00 == 0) {
      return sVar3;
    }
    uVar1 = *(uint *)((long)pUserData + 0x270);
    __n = (ulong)uVar1;
    if (__n_00 <= __n) break;
    if (__n != 0) {
      memcpy(bufferOut,
             (void *)((long)pUserData + (ulong)(*(int *)((long)pUserData + 0x274) - uVar1) + 0x278),
             __n);
      sVar3 = sVar3 + *(uint *)((long)pUserData + 0x270);
      bufferOut = (void *)((long)bufferOut + (ulong)*(uint *)((long)pUserData + 0x270));
      *(undefined4 *)((long)pUserData + 0x270) = 0;
    }
    mVar2 = ma_dr_flac_oggbs__goto_next_page
                      ((ma_dr_flac_oggbs *)pUserData,ma_dr_flac_ogg_recover_on_crc_mismatch);
    if (mVar2 == 0) {
      return sVar3;
    }
  }
  memcpy(bufferOut,
         (void *)((long)pUserData + (ulong)(*(int *)((long)pUserData + 0x274) - uVar1) + 0x278),
         __n_00);
  *(int *)((long)pUserData + 0x270) = *(int *)((long)pUserData + 0x270) - (int)__n_00;
  return bytesToRead;
}

Assistant:

static size_t ma_dr_flac__on_read_ogg(void* pUserData, void* bufferOut, size_t bytesToRead)
{
    ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pUserData;
    ma_uint8* pRunningBufferOut = (ma_uint8*)bufferOut;
    size_t bytesRead = 0;
    MA_DR_FLAC_ASSERT(oggbs != NULL);
    MA_DR_FLAC_ASSERT(pRunningBufferOut != NULL);
    while (bytesRead < bytesToRead) {
        size_t bytesRemainingToRead = bytesToRead - bytesRead;
        if (oggbs->bytesRemainingInPage >= bytesRemainingToRead) {
            MA_DR_FLAC_COPY_MEMORY(pRunningBufferOut, oggbs->pageData + (oggbs->pageDataSize - oggbs->bytesRemainingInPage), bytesRemainingToRead);
            bytesRead += bytesRemainingToRead;
            oggbs->bytesRemainingInPage -= (ma_uint32)bytesRemainingToRead;
            break;
        }
        if (oggbs->bytesRemainingInPage > 0) {
            MA_DR_FLAC_COPY_MEMORY(pRunningBufferOut, oggbs->pageData + (oggbs->pageDataSize - oggbs->bytesRemainingInPage), oggbs->bytesRemainingInPage);
            bytesRead += oggbs->bytesRemainingInPage;
            pRunningBufferOut += oggbs->bytesRemainingInPage;
            oggbs->bytesRemainingInPage = 0;
        }
        MA_DR_FLAC_ASSERT(bytesRemainingToRead > 0);
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch)) {
            break;
        }
    }
    return bytesRead;
}